

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O2

bool wal_txn_exists(filemgr *file)

{
  list_elem *plVar1;
  list *plVar2;
  
  pthread_spin_lock(&file->wal->lock);
  plVar2 = &file->wal->txn_list;
  do {
    plVar1 = plVar2->head;
    if (plVar1 == (list_elem *)0x0) break;
    plVar2 = (list *)&plVar1->next;
  } while ((fdb_txn *)plVar1[1].prev == &file->global_txn);
  pthread_spin_unlock(&file->wal->lock);
  return plVar1 != (list_elem *)0x0;
}

Assistant:

bool wal_txn_exists(struct filemgr *file)
{
    struct list_elem *le;
    struct wal_txn_wrapper *txn_wrapper;
    fdb_txn *txn;

    spin_lock(&file->wal->lock);

    le = list_begin(&file->wal->txn_list);
    while(le) {
        txn_wrapper = _get_entry(le, struct wal_txn_wrapper, le);
        txn = txn_wrapper->txn;
        if (txn != &file->global_txn) {
            spin_unlock(&file->wal->lock);
            return true;
        }
        le = list_next(le);
    }
    spin_unlock(&file->wal->lock);

    return false;
}